

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_0::ReportReflectionUsageEnumTypeError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,
               EnumValueDescriptor *value)

{
  LogMessage *pLVar1;
  string *psVar2;
  EnumDescriptor *this;
  LogFinisher local_6d [13];
  LogMessage local_60;
  EnumValueDescriptor *local_28;
  EnumValueDescriptor *value_local;
  char *method_local;
  FieldDescriptor *field_local;
  Descriptor *descriptor_local;
  
  local_28 = value;
  value_local = (EnumValueDescriptor *)method;
  method_local = (char *)field;
  field_local = (FieldDescriptor *)descriptor;
  LogMessage::LogMessage
            (&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
             ,0x7a);
  pLVar1 = LogMessage::operator<<
                     (&local_60,
                      "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar1 = LogMessage::operator<<(pLVar1,(char *)value_local);
  pLVar1 = LogMessage::operator<<(pLVar1,"\n  Message type: ");
  psVar2 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_local);
  pLVar1 = LogMessage::operator<<(pLVar1,psVar2);
  pLVar1 = LogMessage::operator<<(pLVar1,"\n  Field       : ");
  psVar2 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)method_local);
  pLVar1 = LogMessage::operator<<(pLVar1,psVar2);
  pLVar1 = LogMessage::operator<<
                     (pLVar1,
                      "\n  Problem     : Enum value did not match field type:\n    Expected  : ");
  this = FieldDescriptor::enum_type((FieldDescriptor *)method_local);
  psVar2 = EnumDescriptor::full_name_abi_cxx11_(this);
  pLVar1 = LogMessage::operator<<(pLVar1,psVar2);
  pLVar1 = LogMessage::operator<<(pLVar1,"\n    Actual    : ");
  psVar2 = EnumValueDescriptor::full_name_abi_cxx11_(local_28);
  pLVar1 = LogMessage::operator<<(pLVar1,psVar2);
  LogFinisher::operator=(local_6d,pLVar1);
  LogMessage::~LogMessage(&local_60);
  return;
}

Assistant:

static void ReportReflectionUsageEnumTypeError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, const EnumValueDescriptor* value) {
  GOOGLE_LOG(FATAL)
    << "Protocol Buffer reflection usage error:\n"
       "  Method      : google::protobuf::Reflection::" << method << "\n"
       "  Message type: " << descriptor->full_name() << "\n"
       "  Field       : " << field->full_name() << "\n"
       "  Problem     : Enum value did not match field type:\n"
       "    Expected  : " << field->enum_type()->full_name() << "\n"
       "    Actual    : " << value->full_name();
}